

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

result_type
time_plain<boost::random::additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,40014u,0u,2147483563u>,boost::random::linear_congruential_engine<unsigned_int,40692u,0u,2147483399u>>>
          (additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,_40014U,_0U,_2147483563U>,_boost::random::linear_congruential_engine<unsigned_int,_40692U,_0U,_2147483399U>_>
           *r)

{
  result_type rVar1;
  result_type rVar2;
  time_t *in_RSI;
  long lVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  timer T;
  string res;
  double local_28;
  
  T._resolution = 1e-06;
  T._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  rVar2 = 0;
  lVar3 = 0x1000000;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    rVar1 = boost::random::
            additive_combine_engine<boost::random::linear_congruential_engine<unsigned_int,_40014U,_0U,_2147483563U>,_boost::random::linear_congruential_engine<unsigned_int,_40692U,_0U,_2147483399U>_>
            ::operator()(r);
    rVar2 = rVar2 + rVar1;
  }
  timer::time(&T,in_RSI);
  local_28 = 16.777216 / extraout_XMM0_Qa;
  to_string<double>(&res,&local_28);
  while (res._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&res);
  }
  std::operator<<((ostream *)&std::cout,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  return rVar2;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}